

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block.cc
# Opt level: O0

void __thiscall
leveldb::FilterBlockReader::FilterBlockReader
          (FilterBlockReader *this,FilterPolicy *policy,Slice *contents)

{
  char cVar1;
  uint32_t uVar2;
  size_t sVar3;
  char *pcVar4;
  uint32_t last_word;
  size_t n;
  Slice *contents_local;
  FilterPolicy *policy_local;
  FilterBlockReader *this_local;
  
  this->policy_ = policy;
  this->data_ = (char *)0x0;
  this->offset_ = (char *)0x0;
  this->num_ = 0;
  this->base_lg_ = 0;
  sVar3 = Slice::size(contents);
  if (4 < sVar3) {
    cVar1 = Slice::operator[](contents,sVar3 - 1);
    this->base_lg_ = (long)cVar1;
    pcVar4 = Slice::data(contents);
    uVar2 = DecodeFixed32(pcVar4 + (sVar3 - 5));
    if ((ulong)uVar2 <= sVar3 - 5) {
      pcVar4 = Slice::data(contents);
      this->data_ = pcVar4;
      this->offset_ = this->data_ + uVar2;
      this->num_ = (sVar3 - 5) - (ulong)uVar2 >> 2;
    }
  }
  return;
}

Assistant:

FilterBlockReader::FilterBlockReader(const FilterPolicy* policy,
                                     const Slice& contents)
    : policy_(policy), data_(nullptr), offset_(nullptr), num_(0), base_lg_(0) {
  size_t n = contents.size();
  if (n < 5) return;  // 1 byte for base_lg_ and 4 for start of offset array
  base_lg_ = contents[n - 1];
  uint32_t last_word = DecodeFixed32(contents.data() + n - 5);
  if (last_word > n - 5) return;
  data_ = contents.data();
  offset_ = data_ + last_word;
  num_ = (n - 5 - last_word) / 4;
}